

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MGraph.c
# Opt level: O0

void sorted_edges(EData *edges,int elen)

{
  EData EVar1;
  EData tmp;
  int j_1;
  int i_1;
  int j;
  int i;
  int elen_local;
  EData *edges_local;
  
  for (tmp.weight = 0; tmp._0_4_ = tmp.weight, tmp.weight < elen; tmp.weight = tmp.weight + 1) {
    while (tmp._0_4_ = tmp._0_4_ + 1, (int)tmp._0_4_ < elen) {
      if (edges[(int)tmp._0_4_].weight < edges[tmp.weight].weight) {
        EVar1 = edges[tmp.weight];
        edges[tmp.weight] = edges[(int)tmp._0_4_];
        edges[(int)tmp._0_4_] = EVar1;
      }
    }
  }
  return;
}

Assistant:

void sorted_edges(EData* edges, int elen)
{
    int i,j;

    for (int i = 0; i < elen; ++i) {
        for (int j = i + 1; j < elen; ++j) {
            if (edges[i].weight > edges[j].weight){
                //交换"第i条边"和"第j条边"
                EData tmp = edges[i];
                edges[i] = edges[j];
                edges[j] = tmp;
            }
        }
    }
}